

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_unsigned_long_&>::Matcher
          (Matcher<const_unsigned_long_&> *this,unsigned_long *value)

{
  ComparisonBase<testing::internal::EqMatcher<unsigned_long>,_unsigned_long,_std::equal_to<void>_>
  local_38;
  Matcher<const_unsigned_long_&> local_30;
  unsigned_long *local_18;
  unsigned_long *value_local;
  Matcher<const_unsigned_long_&> *this_local;
  
  local_18 = value;
  value_local = (unsigned_long *)this;
  internal::MatcherBase<const_unsigned_long_&>::MatcherBase
            (&this->super_MatcherBase<const_unsigned_long_&>);
  (this->super_MatcherBase<const_unsigned_long_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_002e76b8;
  local_38.rhs_ = (unsigned_long)Eq<unsigned_long>(*local_18);
  Matcher<unsigned_long_const&>::Matcher<testing::internal::EqMatcher<unsigned_long>,void>
            ((Matcher<unsigned_long_const&> *)&local_30,(EqMatcher<unsigned_long> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}